

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigIsoSlow.c
# Opt level: O3

void Iso_ManBreakTies(Iso_Man_t *p,int fVerbose)

{
  int iVar1;
  void **ppvVar2;
  Vec_Ptr_t *pVVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  int iVar7;
  Iso_Obj_t *pIVar8;
  
  pVVar3 = p->vClasses;
  uVar4 = pVVar3->nSize;
  if ((int)uVar4 < 1) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  uVar6 = **pVVar3->pArray & 0x3fffffff;
  if (fVerbose != 0) {
    printf("Best level %d\n",(ulong)uVar6);
    pVVar3 = p->vClasses;
    uVar4 = pVVar3->nSize;
    if ((int)uVar4 < 1) {
      return;
    }
  }
  ppvVar2 = pVVar3->pArray;
  uVar5 = 0;
  while( true ) {
    pIVar8 = (Iso_Obj_t *)ppvVar2[uVar5];
    if ((*(uint *)pIVar8 & 0x3fffffff) < uVar6) {
      return;
    }
    if (pIVar8->Id != 0) break;
    iVar7 = p->nObjIds;
    while( true ) {
      pIVar8->Id = iVar7;
      iVar1 = pIVar8->iClass;
      if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) {
        p->nObjIds = iVar7 + 1;
        __assert_fail("i >= 0 && i < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigIsoSlow.c"
                      ,300,"Iso_Obj_t *Iso_ManObj(Iso_Man_t *, int)");
      }
      if (iVar1 == 0) break;
      pIVar8 = p->pObjs + iVar1;
      iVar7 = iVar7 + 1;
      if (pIVar8->Id != 0) {
        p->nObjIds = iVar7;
        goto LAB_006e9380;
      }
    }
    p->nObjIds = iVar7 + 1;
    uVar5 = uVar5 + 1;
    if (uVar5 == uVar4) {
      return;
    }
  }
LAB_006e9380:
  __assert_fail("pTemp->Id == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigIsoSlow.c"
                ,0x424,"void Iso_ManBreakTies(Iso_Man_t *, int)");
}

Assistant:

void Iso_ManBreakTies( Iso_Man_t * p, int fVerbose )
{
    int fUseOneBest = 0;
    Iso_Obj_t * pIso, * pTemp;
    int i, LevelStart = 0;
    pIso = (Iso_Obj_t *)Vec_PtrEntry( p->vClasses, 0 );
    LevelStart = pIso->Level;
    if ( fVerbose )
        printf( "Best level %d\n", LevelStart ); 
    Vec_PtrForEachEntry( Iso_Obj_t *, p->vClasses, pIso, i )
    {
        if ( (int)pIso->Level < LevelStart )
            break;
        if ( !fUseOneBest )
        {
            for ( pTemp = pIso; pTemp; pTemp = Iso_ManObj(p, pTemp->iClass) )
            {
                assert( pTemp->Id ==  0 );
                pTemp->Id = p->nObjIds++;
            }
            continue;
        }
        if ( pIso->Level == 0 )//&& pIso->nFoutPos + pIso->nFoutNeg == 0 )
        {
            for ( pTemp = pIso; pTemp; pTemp = Iso_ManObj(p, pTemp->iClass) )
                pTemp->Id = p->nObjIds++;
            continue;
        }
        pIso = Iso_ManFindBestObj( p, pIso );
        pIso->Id = p->nObjIds++;
    }
}